

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

string * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000011;
  char *pcVar4;
  allocator local_59;
  double local_58;
  char formatString [6];
  char buffer [36];
  
  local_58 = value;
  sprintf(formatString,"%%.%dg",CONCAT71(in_register_00000011,useSpecialFloats),
          CONCAT44(in_register_0000000c,precision));
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    uVar1 = snprintf(buffer,0x24,formatString,local_58);
    pcVar4 = strchr(buffer,0x2e);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strchr(buffer,0x65);
      if (pcVar4 == (char *)0x0) {
        sVar3 = strlen(buffer);
        (buffer + sVar3)[0] = '.';
        (buffer + sVar3)[1] = '0';
        buffer[sVar3 + 2] = '\0';
      }
    }
  }
  else {
    if (NAN(local_58)) {
      pcVar2 = "NaN";
      pcVar4 = "null";
    }
    else if (0.0 <= local_58) {
      pcVar2 = "Infinity";
      pcVar4 = "1e+9999";
    }
    else {
      pcVar2 = "-Infinity";
      pcVar4 = "-1e+9999";
    }
    if ((char)this != '\0') {
      pcVar4 = pcVar2;
    }
    uVar1 = snprintf(buffer,0x24,pcVar4);
  }
  if (-1 < (int)uVar1) {
    for (pcVar4 = buffer; pcVar4 < buffer + uVar1; pcVar4 = pcVar4 + 1) {
      if (*pcVar4 == ',') {
        *pcVar4 = '.';
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,buffer,&local_59);
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kong36088[P]LeetCodeLib/lib/jsoncpp.cpp"
                ,0x1098,
                "std::string Json::(anonymous namespace)::valueToString(double, bool, unsigned int)"
               );
}

Assistant:

JSONCPP_STRING valueToString(double value, bool useSpecialFloats, unsigned int precision) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[36];
  int len = -1;

  char formatString[6];
  sprintf(formatString, "%%.%dg", precision);

  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distingish the
  // concepts of reals and integers.
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), formatString, value);
    
    // try to ensure we preserve the fact that this was given to us as a double on input
    if (!strstr(buffer, ".") && !strstr(buffer, "e")) {
      strcat(buffer, ".0");
    }

  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "NaN" : "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "-Infinity" : "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "Infinity" : "1e+9999");
    }
    // For those, we do not need to call fixNumLoc, but it is fast.
  }
  assert(len >= 0);
  fixNumericLocale(buffer, buffer + len);
  return buffer;
}